

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshpubk.c
# Opt level: O3

int rsa1_loadpub_s(BinarySource *src,BinarySink *bs,char **commentptr,char **errorstr)

{
  _Bool _Var1;
  int iVar2;
  char *__s;
  size_t sVar3;
  size_t sVar4;
  mp_int *x;
  size_t sVar5;
  char *pcVar6;
  char *pcVar7;
  ptrlen pVar8;
  char *error;
  RSAKey key;
  char *local_98;
  char *local_90;
  mp_int *local_88;
  char *local_80;
  RSAKey local_78;
  
  local_98 = (char *)0x0;
  pVar8.len = 0x21;
  pVar8.ptr = "SSH PRIVATE KEY FILE FORMAT 1.1\n";
  _Var1 = expect_signature(src,pVar8);
  BinarySource_REWIND_TO__(src->binarysource_,0);
  if (_Var1) {
    local_78.iqmp = (mp_int *)0x0;
    local_78.comment = (char *)0x0;
    local_78.p = (mp_int *)0x0;
    local_78.q = (mp_int *)0x0;
    local_78.exponent = (mp_int *)0x0;
    local_78.private_exponent = (mp_int *)0x0;
    local_78.bits = 0;
    local_78.bytes = 0;
    local_78.modulus = (mp_int *)0x0;
    local_78.sshk.vt = (ssh_keyalg *)0x0;
    iVar2 = rsa1_load_s_internal(src,&local_78,true,commentptr,(char *)0x0,&local_98);
    if (iVar2 != 0) {
      rsa_ssh1_public_blob(bs,&local_78,RSA_SSH1_EXPONENT_FIRST);
      freersakey(&local_78);
      return 1;
    }
    goto LAB_00127e24;
  }
  pVar8 = BinarySource_get_chomped_line(src->binarysource_);
  __s = mkstr(pVar8);
  sVar3 = strspn(__s,"0123456789");
  if (__s[sVar3] == ' ') {
    pcVar6 = __s + sVar3;
    *pcVar6 = '\0';
    sVar3 = strspn(pcVar6 + 1,"0123456789");
    if (pcVar6[sVar3 + 1] == ' ') {
      pcVar7 = pcVar6 + sVar3 + 1;
      local_80 = pcVar6 + sVar3 + 2;
      *pcVar7 = '\0';
      sVar4 = strspn(local_80,"0123456789");
      if (pcVar6[sVar4 + sVar3 + 2] == '\0') {
        local_90 = (char *)0x0;
      }
      else {
        if (pcVar6[sVar4 + sVar3 + 2] != ' ') goto LAB_00127e11;
        pcVar7[sVar4 + 1] = '\0';
        local_90 = pcVar7 + sVar4 + 2;
      }
      local_78.iqmp = (mp_int *)0x0;
      local_78.comment = (char *)0x0;
      local_78.p = (mp_int *)0x0;
      local_78.q = (mp_int *)0x0;
      local_78.exponent = (mp_int *)0x0;
      local_78.private_exponent = (mp_int *)0x0;
      local_78.bits = 0;
      local_78.bytes = 0;
      local_78.modulus = (mp_int *)0x0;
      local_78.sshk.vt = (ssh_keyalg *)0x0;
      local_88 = mp_from_decimal(pcVar6 + 1);
      local_78.exponent = local_88;
      x = mp_from_decimal(local_80);
      local_78.modulus = x;
      iVar2 = atoi(__s);
      sVar5 = mp_get_nbits(x);
      if (sVar5 == (long)iVar2) {
        if (commentptr != (char **)0x0) {
          if (local_90 == (char *)0x0) {
            pcVar6 = (char *)0x0;
          }
          else {
            pcVar6 = dupstr(local_90);
          }
          *commentptr = pcVar6;
        }
        rsa_ssh1_public_blob(bs,&local_78,RSA_SSH1_EXPONENT_FIRST);
        freersakey(&local_78);
        safefree(__s);
        return 1;
      }
      mp_free(local_88);
      mp_free(x);
      safefree(__s);
      local_98 = "key bit count does not match in SSH-1 public key file";
      goto LAB_00127e24;
    }
  }
LAB_00127e11:
  safefree(__s);
  local_98 = "not an SSH-1 RSA file";
LAB_00127e24:
  if (errorstr != (char **)0x0) {
    *errorstr = local_98;
  }
  return 0;
}

Assistant:

int rsa1_loadpub_s(BinarySource *src, BinarySink *bs,
                   char **commentptr, const char **errorstr)
{
    RSAKey key;
    int ret;
    const char *error = NULL;

    /* Default return if we fail. */
    ret = 0;

    bool is_privkey_file = expect_signature(src, rsa1_signature);
    BinarySource_REWIND(src);

    if (is_privkey_file) {
        /*
         * Load just the public half from an SSH-1 private key file.
         */
        memset(&key, 0, sizeof(key));
        if (rsa1_load_s_internal(src, &key, true, commentptr, NULL, &error)) {
            rsa_ssh1_public_blob(bs, &key, RSA_SSH1_EXPONENT_FIRST);
            freersakey(&key);
            ret = 1;
        }
    } else {
        /*
         * Try interpreting the file as an SSH-1 public key.
         */
        char *line, *p, *bitsp, *expp, *modp, *commentp;

        line = mkstr(get_chomped_line(src));
        p = line;

        bitsp = p;
        p += strspn(p, "0123456789");
        if (*p != ' ')
            goto not_public_either;
        *p++ = '\0';

        expp = p;
        p += strspn(p, "0123456789");
        if (*p != ' ')
            goto not_public_either;
        *p++ = '\0';

        modp = p;
        p += strspn(p, "0123456789");
        if (*p) {
            if (*p != ' ')
                goto not_public_either;
            *p++ = '\0';
            commentp = p;
        } else {
            commentp = NULL;
        }

        memset(&key, 0, sizeof(key));
        key.exponent = mp_from_decimal(expp);
        key.modulus = mp_from_decimal(modp);
        if (atoi(bitsp) != mp_get_nbits(key.modulus)) {
            mp_free(key.exponent);
            mp_free(key.modulus);
            sfree(line);
            error = "key bit count does not match in SSH-1 public key file";
            goto end;
        }
        if (commentptr)
            *commentptr = commentp ? dupstr(commentp) : NULL;
        rsa_ssh1_public_blob(bs, &key, RSA_SSH1_EXPONENT_FIRST);
        freersakey(&key);
        sfree(line);
        return 1;

      not_public_either:
        sfree(line);
        error = "not an SSH-1 RSA file";
    }

  end:
    if ((ret != 1) && errorstr)
        *errorstr = error;
    return ret;
}